

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O0

void __thiscall
dynamicgraph::
Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::set
          (Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,istringstream *stringValue)

{
  string local_38;
  istringstream *local_18;
  istringstream *stringValue_local;
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_local;
  
  local_18 = stringValue;
  stringValue_local = (istringstream *)this;
  signal_io<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::cast
            (&local_38,stringValue);
  (*(this->super_SignalBase<int>)._vptr_SignalBase[0x1f])(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Signal<T, Time>::set(std::istringstream &stringValue) {
  (*this) = signal_io<T>::cast(stringValue);
}